

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O1

DSFrame * __thiscall
DSFrame::Create(DSFrame *__return_storage_ptr__,DSFrame *this,bool copy,bool inplace)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DSVideoInfo vi;
  VSFrameRef *pVVar4;
  long lVar5;
  uchar **ppuVar6;
  uint8_t *puVar7;
  undefined8 *puVar8;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  DSFormat *pDVar9;
  ulong uVar10;
  byte bVar11;
  VSFrameRef *copy_frames [1];
  int copy_planes [4];
  undefined8 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffee0 [80];
  VSFrameRef *local_c8;
  ulong local_c0;
  ulong local_b8;
  undefined8 local_b0;
  int64_t local_a8;
  undefined8 uStack_a0;
  int local_98 [4];
  DSFormat local_88;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48;
  int64_t local_40;
  undefined8 uStack_38;
  
  bVar11 = 0;
  if (this->_vssrc == (VSFrameRef *)0x0) {
    if ((this->_avssrc).p == (VideoFrame *)0x0) {
      puVar8 = (undefined8 *)
               __cxa_allocate_exception
                         (8,this,CONCAT71(in_register_00000011,copy),
                          CONCAT71(in_register_00000009,inplace));
      *puVar8 = "Unable to create from nothing.";
      __cxa_throw(puVar8,&char_const*::typeinfo,0);
    }
    local_b0._0_4_ = (this->_vi).width;
    local_b0._4_4_ = (this->_vi).height;
    local_b8 = (ulong)(this->_vi).fps_numerator;
    local_c0 = (ulong)(this->_vi).fps_denominator;
    iVar1 = (this->_vi).num_frames;
    iVar2 = (this->_vi).audio_samples_per_second;
    iVar3 = (this->_vi).sample_type;
    local_a8 = (this->_vi).num_audio_samples;
    uStack_a0._0_4_ = (this->_vi).nchannels;
    uStack_a0._4_4_ = (this->_vi).image_type;
    DSFormat::DSFormat(&local_88,(this->_vi).pixel_type);
    local_68 = local_b8;
    local_60 = local_c0;
    local_58 = local_b0;
    local_50 = iVar1;
    local_4c = iVar2;
    local_48 = iVar3;
    local_40 = local_a8;
    uStack_38 = uStack_a0;
    pDVar9 = &local_88;
    puVar8 = (undefined8 *)&stack0xfffffffffffffed8;
    for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *(undefined8 *)pDVar9;
      pDVar9 = (DSFormat *)((long)pDVar9 + (ulong)bVar11 * -0x10 + 8);
      puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    }
    vi.Format.SSW = in_stack_fffffffffffffee0._0_4_;
    vi.Format.SSH = in_stack_fffffffffffffee0._4_4_;
    vi.Format.BitsPerSample = in_stack_fffffffffffffee0._8_4_;
    vi.Format.BytesPerSample = in_stack_fffffffffffffee0._12_4_;
    vi.Format.Planes = in_stack_fffffffffffffee0._16_4_;
    vi._28_4_ = in_stack_fffffffffffffee0._20_4_;
    vi.FPSNum = in_stack_fffffffffffffee0._24_8_;
    vi.FPSDenom = in_stack_fffffffffffffee0._32_8_;
    vi.Width = in_stack_fffffffffffffee0._40_4_;
    vi.Height = in_stack_fffffffffffffee0._44_4_;
    vi.Frames = in_stack_fffffffffffffee0._48_4_;
    vi.Audio_SPS = in_stack_fffffffffffffee0._52_4_;
    vi.Audio_SType = in_stack_fffffffffffffee0._56_4_;
    vi._68_4_ = in_stack_fffffffffffffee0._60_4_;
    vi.Audio_NSamples = in_stack_fffffffffffffee0._64_8_;
    vi.Audio_NChannels = in_stack_fffffffffffffee0._72_4_;
    vi.Field = in_stack_fffffffffffffee0._76_4_;
    vi.Format.IsFamilyYUV = (bool)(char)in_stack_fffffffffffffed8;
    vi.Format.IsFamilyRGB = (bool)(char)((ulong)in_stack_fffffffffffffed8 >> 8);
    vi.Format.IsFamilyYCC = (bool)(char)((ulong)in_stack_fffffffffffffed8 >> 0x10);
    vi.Format.IsInteger = (bool)(char)((ulong)in_stack_fffffffffffffed8 >> 0x18);
    vi.Format.IsFloat = (bool)(char)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    vi.Format._5_3_ = (int3)((ulong)in_stack_fffffffffffffed8 >> 0x28);
    Create(__return_storage_ptr__,this,vi);
  }
  else {
    pVVar4 = this->_vssrc;
    if (this->_vsdst != (VSFrameRef *)0x0) {
      pVVar4 = this->_vsdst;
    }
    local_c8 = (*this->_vsapi->cloneFrameRef)(pVVar4);
    local_98[0] = 0;
    local_98[1] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    if (copy) {
      pVVar4 = (*this->_vsapi->newVideoFrame2)
                         (this->_vsformat,this->FrameWidth,this->FrameHeight,&local_c8,local_98,
                          this->_vssrc,this->_vscore);
    }
    else {
      pVVar4 = (*this->_vsapi->newVideoFrame)
                         (this->_vsformat,this->FrameWidth,this->FrameHeight,this->_vssrc,
                          this->_vscore);
    }
    (*this->_vsapi->freeFrame)(local_c8);
    DSFrame(__return_storage_ptr__,pVVar4,this->_vscore,this->_vsapi);
    __return_storage_ptr__->_vsdst = pVVar4;
    lVar5 = (long)(this->Format).Planes;
    uVar10 = 0xffffffffffffffff;
    if (-1 < lVar5) {
      uVar10 = lVar5 * 8;
    }
    ppuVar6 = (uchar **)operator_new__(uVar10);
    __return_storage_ptr__->DstPointers = ppuVar6;
    if (0 < (this->Format).Planes) {
      lVar5 = 0;
      do {
        puVar7 = (*this->_vsapi->getWritePtr)(pVVar4,(int)lVar5);
        __return_storage_ptr__->DstPointers[lVar5] = puVar7;
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->Format).Planes);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DSFrame Create(bool copy, bool inplace)
  {
    if (_vssrc) {
      // Create a new VS frame
      const VSFrameRef* copy_frames[1] {ToVSFrame()};
      int copy_planes[4] = {0};
      auto vsframe = copy ?
        _vsapi->newVideoFrame2(_vsformat, FrameWidth, FrameHeight, copy_frames, copy_planes, _vssrc, const_cast<VSCore*>(_vscore)) :
        _vsapi->newVideoFrame(_vsformat, FrameWidth, FrameHeight, _vssrc, const_cast<VSCore*>(_vscore));
      _vsapi->freeFrame(copy_frames[0]);

      DSFrame new_frame(vsframe, _vscore, _vsapi);
      new_frame._vsdst = vsframe;
      new_frame.DstPointers = new unsigned char*[Format.Planes];
      for (int i = 0; i < Format.Planes; i++)
        new_frame.DstPointers[i] = _vsapi->getWritePtr(vsframe, i);
      return new_frame;
    }
    else if(_avssrc) {
      // Create a new AVS frame
      return Create(_vi);
    }
    throw "Unable to create from nothing.";
  }